

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvrm.c
# Opt level: O0

void handle_nvrm_ioctl_create_vspace56(uint32_t fd,nvrm_ioctl_create_vspace56 *s)

{
  gpu_object *obj_00;
  gpu_object *obj;
  nvrm_ioctl_create_vspace56 *s_local;
  uint32_t fd_local;
  
  if (s->status == 0) {
    check_cid(s->cid);
    obj_00 = nvrm_add_object(fd,s->cid,s->parent,s->handle,s->cls);
    if (obj_00 == (gpu_object *)0x0) {
      fprintf(_stdout,"ERROR: nvrm_ioctl_create_vspace56: cannot find object 0x%08x 0x%08x\n",
              (ulong)s->cid,(ulong)s->handle);
      if (mmt_sync_fd != -1) {
        fflush(_stdout);
      }
    }
    else if (s->map_id != 0) {
      host_map(obj_00,fd,0,0,s->limit + 1,0,s->map_id);
    }
  }
  return;
}

Assistant:

static void handle_nvrm_ioctl_create_vspace56(uint32_t fd, struct nvrm_ioctl_create_vspace56 *s)
{
	if (s->status != NVRM_STATUS_SUCCESS)
		return;
	check_cid(s->cid);

	struct gpu_object *obj = nvrm_add_object(fd, s->cid, s->parent, s->handle, s->cls);
	if (!obj)
	{
		mmt_error("nvrm_ioctl_create_vspace56: cannot find object 0x%08x 0x%08x\n", s->cid, s->handle);
		return;
	}

	if (s->map_id)
		host_map(obj, fd, 0, 0, s->limit + 1, 0, s->map_id);
}